

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

String * __thiscall Client::getDebugInfo(String *__return_storage_ptr__,Client *this)

{
  ushort uVar1;
  bool bVar2;
  char *pcVar3;
  Socket *this_00;
  ulong uVar4;
  time_t tVar5;
  usize uVar6;
  char *pcVar7;
  char *pcVar8;
  Client *this_01;
  undefined4 local_174;
  String local_120;
  String local_f8;
  String local_d0;
  String local_a8;
  String local_70;
  String local_48;
  undefined1 local_19;
  Client *local_18;
  Client *this_local;
  String *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Client *)__return_storage_ptr__;
  String::String<5ul>(__return_storage_ptr__,(char (*) [5])"<tr>");
  Socket::inetNtoA(&local_70,(this->_address).addr);
  pcVar3 = String::operator_cast_to_char_(&local_70);
  uVar1 = (this->_address).port;
  this_00 = Server::Client::getSocket(this->_handle);
  uVar4 = Socket::getFileDescriptor(this_00);
  this_01 = this->_handle;
  bVar2 = Server::Client::isSuspended(this_01);
  pcVar8 = "active";
  if (bVar2) {
    pcVar8 = "suspended";
  }
  if (this->_lastReadActivity == 0) {
    local_174 = 0xffffffff;
  }
  else {
    tVar5 = Time::time((time_t *)this_01);
    local_174 = (undefined4)((tVar5 - this->_lastReadActivity) / 1000);
  }
  uVar6 = Server::Client::getSendBufferSize(this->_handle);
  pcVar7 = String::operator_cast_to_char_(&this->_destinationHostname);
  String::fromPrintf(&local_48,
                     "<td>%s:%hu</td><td>%d</td><td>%s</td><td>%d</td><td>%d</td><td>%s:%hu</td>",
                     pcVar3,(ulong)uVar1,uVar4 & 0xffffffff,pcVar8,local_174,(int)uVar6,pcVar7,
                     (uint)(this->_destination).port);
  String::operator+=(__return_storage_ptr__,&local_48);
  String::~String(&local_48);
  String::~String(&local_70);
  if ((this->_proxyLine == (ProxyLine *)0x0) || (this->_directLine != (DirectLine *)0x0)) {
    if ((this->_directLine == (DirectLine *)0x0) || (this->_proxyLine != (ProxyLine *)0x0)) {
      String::String<20ul>(&local_f8,(char (*) [20])"<td>connecting</td>");
      String::append(__return_storage_ptr__,&local_f8);
      String::~String(&local_f8);
    }
    else {
      DirectLine::getDebugInfo(&local_d0,this->_directLine);
      String::append(__return_storage_ptr__,&local_d0);
      String::~String(&local_d0);
    }
  }
  else {
    ProxyLine::getDebugInfo(&local_a8,this->_proxyLine);
    String::append(__return_storage_ptr__,&local_a8);
    String::~String(&local_a8);
  }
  String::String<6ul>(&local_120,(char (*) [6])0x12a751);
  String::append(__return_storage_ptr__,&local_120);
  String::~String(&local_120);
  return __return_storage_ptr__;
}

Assistant:

String Client::getDebugInfo() const
{
    String result("<tr>");

    //<td>192.168.0.196:56269</td><td>77</td><td>active</td><td>8</td><td>k8s.pforgeipt.intra.airbusds.corp:443</td>",
    result += String::fromPrintf("<td>%s:%hu</td><td>%d</td><td>%s</td><td>%d</td><td>%d</td><td>%s:%hu</td>",
        (const char*)Socket::inetNtoA(_address.addr), _address.port, (int)_handle.getSocket().getFileDescriptor(),
        _handle.isSuspended() ? "suspended" : "active", _lastReadActivity ? (int)((Time::time() - _lastReadActivity) / 1000) : (int)-1,
        (int)_handle.getSendBufferSize(),
        (const char*)_destinationHostname, _destination.port);

    if (_proxyLine && !_directLine)
        result.append(_proxyLine->getDebugInfo());
    else if (_directLine && !_proxyLine)
        result.append(_directLine->getDebugInfo());
    else
        result.append(String("<td>connecting</td>"));

    result.append("</tr>");
    return result;
}